

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

int xmlRelaxNGGenerateAttributes(xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict def)

{
  xmlRelaxNGDefinePtr *ppxVar1;
  xmlRelaxNGType xVar2;
  int iVar3;
  xmlRelaxNGDefinePtr pxVar4;
  xmlRelaxNGDefinePtr pxVar5;
  xmlRelaxNGDefinePtr pxVar6;
  
  iVar3 = -1;
  if ((ctxt->nbErrors == 0) && (iVar3 = 1, pxVar4 = def, def != (xmlRelaxNGDefinePtr_conflict)0x0))
  {
    do {
      xVar2 = pxVar4->type;
      if ((uint)(xVar2 + ~XML_RELAXNG_ATTRIBUTE) < 10) {
        pxVar5 = pxVar4->content;
        pxVar6 = pxVar5;
        if (pxVar5 == (xmlRelaxNGDefinePtr)0x0) goto LAB_001881d2;
        do {
          pxVar6->parent = pxVar4;
          ppxVar1 = &pxVar6->next;
          pxVar6 = *ppxVar1;
        } while (*ppxVar1 != (xmlRelaxNGDefinePtr)0x0);
      }
      else {
        if (((uint)xVar2 < 9) &&
           ((0x1f9U >> (xVar2 & (XML_RELAXNG_ONEORMORE|XML_RELAXNG_ZEROORMORE)) & 1) != 0)) {
          return 0;
        }
LAB_001881d2:
        do {
          if (pxVar4 == def) {
            return 1;
          }
          pxVar5 = pxVar4->next;
          if (pxVar5 != (xmlRelaxNGDefinePtr)0x0) goto LAB_001881be;
          pxVar4 = pxVar4->parent;
        } while (pxVar4 != (xmlRelaxNGDefinePtr)0x0);
        pxVar5 = (xmlRelaxNGDefinePtr)0x0;
      }
LAB_001881be:
      pxVar4 = pxVar5;
    } while (pxVar5 != (xmlRelaxNGDefinePtr)0x0);
  }
  return iVar3;
}

Assistant:

static int
xmlRelaxNGGenerateAttributes(xmlRelaxNGParserCtxtPtr ctxt,
                             xmlRelaxNGDefinePtr def)
{
    xmlRelaxNGDefinePtr parent, cur, tmp;

    /*
     * Don't run that check in case of error. Infinite recursion
     * becomes possible.
     */
    if (ctxt->nbErrors != 0)
        return (-1);

    parent = NULL;
    cur = def;
    while (cur != NULL) {
        if ((cur->type == XML_RELAXNG_ELEMENT) ||
            (cur->type == XML_RELAXNG_TEXT) ||
            (cur->type == XML_RELAXNG_DATATYPE) ||
            (cur->type == XML_RELAXNG_PARAM) ||
            (cur->type == XML_RELAXNG_LIST) ||
            (cur->type == XML_RELAXNG_VALUE) ||
            (cur->type == XML_RELAXNG_EMPTY))
            return (0);
        if ((cur->type == XML_RELAXNG_CHOICE) ||
            (cur->type == XML_RELAXNG_INTERLEAVE) ||
            (cur->type == XML_RELAXNG_GROUP) ||
            (cur->type == XML_RELAXNG_ONEORMORE) ||
            (cur->type == XML_RELAXNG_ZEROORMORE) ||
            (cur->type == XML_RELAXNG_OPTIONAL) ||
            (cur->type == XML_RELAXNG_PARENTREF) ||
            (cur->type == XML_RELAXNG_EXTERNALREF) ||
            (cur->type == XML_RELAXNG_REF) ||
            (cur->type == XML_RELAXNG_DEF)) {
            if (cur->content != NULL) {
                parent = cur;
                cur = cur->content;
                tmp = cur;
                while (tmp != NULL) {
                    tmp->parent = parent;
                    tmp = tmp->next;
                }
                continue;
            }
        }
        if (cur == def)
            break;
        if (cur->next != NULL) {
            cur = cur->next;
            continue;
        }
        do {
            cur = cur->parent;
            if (cur == NULL)
                break;
            if (cur == def)
                return (1);
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }
        } while (cur != NULL);
    }
    return (1);
}